

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Token __thiscall slang::parsing::Preprocessor::expect(Preprocessor *this,TokenKind kind)

{
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  Info *pIVar1;
  Token matchingDelim;
  Token lastConsumed;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  Token actual;
  Token local_50;
  Token local_40;
  
  actual = peek(this);
  if (actual.kind == kind) {
    uVar2 = (this->currentToken).field_0x2;
    NVar3.raw = (this->currentToken).numFlags.raw;
    uVar4 = (this->currentToken).rawLen;
    pIVar1 = (this->currentToken).info;
    (this->lastConsumed).kind = (this->currentToken).kind;
    (this->lastConsumed).field_0x2 = uVar2;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->lastConsumed).rawLen = uVar4;
    (this->lastConsumed).info = pIVar1;
    Token::Token(&local_50);
    (this->currentToken).kind = local_50.kind;
    (this->currentToken).field_0x2 = local_50._2_1_;
    (this->currentToken).numFlags = (NumericTokenFlags)local_50.numFlags.raw;
    (this->currentToken).rawLen = local_50.rawLen;
    (this->currentToken).info = local_50.info;
  }
  else {
    alloc = this->alloc;
    diagnostics = this->diagnostics;
    lastConsumed = this->lastConsumed;
    Token::Token(&local_40);
    matchingDelim.info = local_40.info;
    matchingDelim.kind = local_40.kind;
    matchingDelim._2_1_ = local_40._2_1_;
    matchingDelim.numFlags.raw = local_40.numFlags.raw;
    matchingDelim.rawLen = local_40.rawLen;
    actual = Token::createExpected(alloc,diagnostics,actual,kind,lastConsumed,matchingDelim);
  }
  return actual;
}

Assistant:

Token Preprocessor::expect(TokenKind kind) {
    auto result = peek();
    if (result.kind != kind)
        return Token::createExpected(alloc, diagnostics, result, kind, lastConsumed, Token());

    lastConsumed = currentToken;
    currentToken = Token();
    return result;
}